

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

int side3_2d_filter(double *p0,double *p1,double *p2,double *p3,double *q0,double *q1,double *q2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  int local_1d0;
  int int_tmp_result_FFWKCAA;
  int r_sign;
  double max7;
  double max6;
  double max5;
  double max4;
  int int_tmp_result;
  int Delta_sign;
  double upper_bound_1;
  double lower_bound_1;
  double max3;
  double max2;
  double max1;
  double eps;
  double r;
  double DeltaLambda2;
  double DeltaLambda1;
  double DeltaLambda0;
  double Delta;
  double b22;
  double b21;
  double b20;
  double b12;
  double b11;
  double b10;
  double b02;
  double b01;
  double b00;
  double a32;
  double a31;
  double a30;
  double a22;
  double a21;
  double a20;
  double a12;
  double q2_1_p0_1;
  double q2_0_p0_0;
  double a11;
  double q1_1_p0_1;
  double q1_0_p0_0;
  double a10;
  double q0_1_p0_1;
  double q0_0_p0_0;
  double l3;
  double p3_1_p0_1;
  double p3_0_p0_0;
  double l2;
  double p2_1_p0_1;
  double p2_0_p0_0;
  double l1;
  double p1_1_p0_1;
  double p1_0_p0_0;
  double *q1_local;
  double *q0_local;
  double *p3_local;
  double *p2_local;
  double *p1_local;
  double *p0_local;
  
  dVar1 = *p1 - *p0;
  dVar2 = p1[1] - p0[1];
  dVar3 = (dVar1 * dVar1 + dVar2 * dVar2) * 1.0;
  dVar4 = *p2 - *p0;
  dVar5 = p2[1] - p0[1];
  dVar6 = (dVar4 * dVar4 + dVar5 * dVar5) * 1.0;
  dVar7 = *p3 - *p0;
  dVar8 = p3[1] - p0[1];
  dVar9 = *q0 - *p0;
  dVar10 = q0[1] - p0[1];
  dVar11 = (dVar1 * dVar9 + dVar2 * dVar10) * 2.0;
  dVar12 = *q1 - *p0;
  dVar13 = q1[1] - p0[1];
  dVar14 = (dVar1 * dVar12 + dVar2 * dVar13) * 2.0;
  dVar15 = *q2 - *p0;
  dVar16 = q2[1] - p0[1];
  dVar17 = (dVar1 * dVar15 + dVar2 * dVar16) * 2.0;
  dVar18 = (dVar4 * dVar9 + dVar5 * dVar10) * 2.0;
  dVar19 = (dVar4 * dVar12 + dVar5 * dVar13) * 2.0;
  dVar20 = (dVar4 * dVar15 + dVar5 * dVar16) * 2.0;
  dVar21 = dVar14 * dVar20 + -(dVar17 * dVar19);
  dVar22 = dVar17 * dVar18 + -(dVar11 * dVar20);
  dVar23 = dVar11 * dVar19 + -(dVar14 * dVar18);
  dVar24 = dVar21 + dVar22 + dVar23;
  dVar3 = dVar24 * (dVar7 * dVar7 + dVar8 * dVar8) * 1.0 +
          -((dVar7 * dVar15 + dVar8 * dVar16) * 2.0 *
            ((dVar18 - dVar19) * dVar3 + (dVar14 - dVar11) * dVar6 + dVar23) +
           (dVar7 * dVar9 + dVar8 * dVar10) * 2.0 *
           ((dVar19 - dVar20) * dVar3 + (dVar17 - dVar14) * dVar6 + dVar21) +
           (dVar7 * dVar12 + dVar8 * dVar13) * 2.0 *
           ((dVar20 - dVar18) * dVar3 + (dVar11 - dVar17) * dVar6 + dVar22));
  max2 = ABS(dVar4);
  if (max2 < ABS(dVar5)) {
    max2 = ABS(dVar5);
  }
  max3 = ABS(dVar9);
  if (max3 < ABS(dVar10)) {
    max3 = ABS(dVar10);
  }
  if (max3 < ABS(dVar12)) {
    max3 = ABS(dVar12);
  }
  if (max3 < ABS(dVar13)) {
    max3 = ABS(dVar13);
  }
  if (max3 < ABS(dVar15)) {
    max3 = ABS(dVar15);
  }
  if (max3 < ABS(dVar16)) {
    max3 = ABS(dVar16);
  }
  lower_bound_1 = ABS(dVar1);
  if (lower_bound_1 < ABS(dVar2)) {
    lower_bound_1 = ABS(dVar2);
  }
  upper_bound_1 = max3;
  _int_tmp_result = max3;
  if (max3 <= max2) {
    if (max3 < max2) {
      _int_tmp_result = max2;
    }
  }
  else {
    upper_bound_1 = max2;
  }
  if (upper_bound_1 <= lower_bound_1) {
    if (_int_tmp_result < lower_bound_1) {
      _int_tmp_result = lower_bound_1;
    }
  }
  else {
    upper_bound_1 = lower_bound_1;
  }
  if (2.7953252803394562e-74 <= upper_bound_1) {
    if (_int_tmp_result <= 2.596148429267413e+33) {
      dVar1 = lower_bound_1 * max3 * max2 * max3 * 3.644307565376031e-14;
      if (dVar24 <= dVar1) {
        if (-dVar1 <= dVar24) {
          return 0;
        }
        max4._0_4_ = -1;
      }
      else {
        max4._0_4_ = 1;
      }
      max5 = max3;
      if (max3 < max2) {
        max5 = max2;
      }
      if (max5 < lower_bound_1) {
        max5 = lower_bound_1;
      }
      max6 = max3;
      if (max3 < lower_bound_1) {
        max6 = lower_bound_1;
      }
      max7 = max3;
      if (max3 < lower_bound_1) {
        max7 = lower_bound_1;
      }
      if (max6 < max7) {
        max6 = max7;
      }
      _int_tmp_result_FFWKCAA = lower_bound_1;
      if (lower_bound_1 < ABS(dVar8)) {
        _int_tmp_result_FFWKCAA = ABS(dVar8);
      }
      if (_int_tmp_result_FFWKCAA < ABS(dVar7)) {
        _int_tmp_result_FFWKCAA = ABS(dVar7);
      }
      if (max6 < _int_tmp_result_FFWKCAA) {
        max6 = _int_tmp_result_FFWKCAA;
      }
      if (max5 < max6) {
        max5 = max6;
      }
      if (max5 < max7) {
        max5 = max7;
      }
      if (max5 < _int_tmp_result_FFWKCAA) {
        max5 = _int_tmp_result_FFWKCAA;
      }
      upper_bound_1 = max3;
      _int_tmp_result = max3;
      if (max2 < max3) {
        upper_bound_1 = max2;
      }
      if (upper_bound_1 <= max5) {
        if (max3 < max5) {
          _int_tmp_result = max5;
        }
      }
      else {
        upper_bound_1 = max5;
      }
      if (max6 < upper_bound_1) {
        upper_bound_1 = max6;
      }
      if (max7 < upper_bound_1) {
        upper_bound_1 = max7;
      }
      if (_int_tmp_result_FFWKCAA < upper_bound_1) {
        upper_bound_1 = _int_tmp_result_FFWKCAA;
      }
      if (6.0198672948616725e-50 <= upper_bound_1) {
        if (_int_tmp_result <= 2.596148429267413e+33) {
          dVar1 = _int_tmp_result_FFWKCAA * max3 * max2 * max7 * max6 * max5 * 4.675444716138007e-13
          ;
          if (dVar3 <= dVar1) {
            if (-dVar1 <= dVar3) {
              return 0;
            }
            local_1d0 = -1;
          }
          else {
            local_1d0 = 1;
          }
          p0_local._4_4_ = max4._0_4_ * local_1d0;
        }
        else {
          p0_local._4_4_ = 0;
        }
      }
      else {
        p0_local._4_4_ = 0;
      }
    }
    else {
      p0_local._4_4_ = 0;
    }
  }
  else {
    p0_local._4_4_ = 0;
  }
  return p0_local._4_4_;
}

Assistant:

inline int side3_2d_filter( const double* p0, const double* p1, const double* p2, const double* p3, const double* q0, const double* q1, const double* q2) {
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double l1;
    l1 = (1 * ((p1_0_p0_0 * p1_0_p0_0) + (p1_1_p0_1 * p1_1_p0_1)));
    double p2_0_p0_0 = (p2[0] - p0[0]);
    double p2_1_p0_1 = (p2[1] - p0[1]);
    double l2;
    l2 = (1 * ((p2_0_p0_0 * p2_0_p0_0) + (p2_1_p0_1 * p2_1_p0_1)));
    double p3_0_p0_0 = (p3[0] - p0[0]);
    double p3_1_p0_1 = (p3[1] - p0[1]);
    double l3;
    l3 = (1 * ((p3_0_p0_0 * p3_0_p0_0) + (p3_1_p0_1 * p3_1_p0_1)));
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double a10;
    a10 = (2 * ((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)));
    double q1_0_p0_0 = (q1[0] - p0[0]);
    double q1_1_p0_1 = (q1[1] - p0[1]);
    double a11;
    a11 = (2 * ((p1_0_p0_0 * q1_0_p0_0) + (p1_1_p0_1 * q1_1_p0_1)));
    double q2_0_p0_0 = (q2[0] - p0[0]);
    double q2_1_p0_1 = (q2[1] - p0[1]);
    double a12;
    a12 = (2 * ((p1_0_p0_0 * q2_0_p0_0) + (p1_1_p0_1 * q2_1_p0_1)));
    double a20;
    a20 = (2 * ((p2_0_p0_0 * q0_0_p0_0) + (p2_1_p0_1 * q0_1_p0_1)));
    double a21;
    a21 = (2 * ((p2_0_p0_0 * q1_0_p0_0) + (p2_1_p0_1 * q1_1_p0_1)));
    double a22;
    a22 = (2 * ((p2_0_p0_0 * q2_0_p0_0) + (p2_1_p0_1 * q2_1_p0_1)));
    double a30;
    a30 = (2 * ((p3_0_p0_0 * q0_0_p0_0) + (p3_1_p0_1 * q0_1_p0_1)));
    double a31;
    a31 = (2 * ((p3_0_p0_0 * q1_0_p0_0) + (p3_1_p0_1 * q1_1_p0_1)));
    double a32;
    a32 = (2 * ((p3_0_p0_0 * q2_0_p0_0) + (p3_1_p0_1 * q2_1_p0_1)));
    double b00;
    b00 = ((a11 * a22) - (a12 * a21));
    double b01;
    b01 = (a21 - a22);
    double b02;
    b02 = (a12 - a11);
    double b10;
    b10 = ((a12 * a20) - (a10 * a22));
    double b11;
    b11 = (a22 - a20);
    double b12;
    b12 = (a10 - a12);
    double b20;
    b20 = ((a10 * a21) - (a11 * a20));
    double b21;
    b21 = (a20 - a21);
    double b22;
    b22 = (a11 - a10);
    double Delta;
    Delta = ((b00 + b10) + b20);
    double DeltaLambda0;
    DeltaLambda0 = (((b01 * l1) + (b02 * l2)) + b00);
    double DeltaLambda1;
    DeltaLambda1 = (((b11 * l1) + (b12 * l2)) + b10);
    double DeltaLambda2;
    DeltaLambda2 = (((b21 * l1) + (b22 * l2)) + b20);
    double r;
    r = ((Delta * l3) - (((a30 * DeltaLambda0) + (a31 * DeltaLambda1)) + (a32 * DeltaLambda2)));
    double eps;
    double max1 = fabs(p2_0_p0_0);
    if( (max1 < fabs(p2_1_p0_1)) )
    {
        max1 = fabs(p2_1_p0_1);
    } 
    double max2 = fabs(q0_0_p0_0);
    if( (max2 < fabs(q0_1_p0_1)) )
    {
        max2 = fabs(q0_1_p0_1);
    } 
    if( (max2 < fabs(q1_0_p0_0)) )
    {
        max2 = fabs(q1_0_p0_0);
    } 
    if( (max2 < fabs(q1_1_p0_1)) )
    {
        max2 = fabs(q1_1_p0_1);
    } 
    if( (max2 < fabs(q2_0_p0_0)) )
    {
        max2 = fabs(q2_0_p0_0);
    } 
    if( (max2 < fabs(q2_1_p0_1)) )
    {
        max2 = fabs(q2_1_p0_1);
    } 
    double max3 = fabs(p1_0_p0_0);
    if( (max3 < fabs(p1_1_p0_1)) )
    {
        max3 = fabs(p1_1_p0_1);
    } 
    double lower_bound_1;
    double upper_bound_1;
    int Delta_sign;
    int int_tmp_result;
    lower_bound_1 = max2;
    upper_bound_1 = max2;
    if( (max1 < lower_bound_1) )
    {
        lower_bound_1 = max1;
    } 
    else 
    {
        if( (max1 > upper_bound_1) )
        {
            upper_bound_1 = max1;
        } 
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    else 
    {
        if( (max3 > upper_bound_1) )
        {
            upper_bound_1 = max3;
        } 
    } 
    if( (lower_bound_1 < 2.79532528033945620759e-74) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 2.59614842926741294957e+33) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (3.64430756537603111258e-14 * (((max3 * max2) * max1) * max2));
        if( (Delta > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (Delta < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    Delta_sign = int_tmp_result;
    double max4 = max2;
    if( (max4 < max1) )
    {
        max4 = max1;
    } 
    if( (max4 < max3) )
    {
        max4 = max3;
    } 
    double max5 = max2;
    if( (max5 < max3) )
    {
        max5 = max3;
    } 
    double max6 = max2;
    if( (max6 < max3) )
    {
        max6 = max3;
    } 
    if( (max5 < max6) )
    {
        max5 = max6;
    } 
    double max7 = max3;
    if( (max7 < fabs(p3_1_p0_1)) )
    {
        max7 = fabs(p3_1_p0_1);
    } 
    if( (max7 < fabs(p3_0_p0_0)) )
    {
        max7 = fabs(p3_0_p0_0);
    } 
    if( (max5 < max7) )
    {
        max5 = max7;
    } 
    if( (max4 < max5) )
    {
        max4 = max5;
    } 
    if( (max4 < max6) )
    {
        max4 = max6;
    } 
    if( (max4 < max7) )
    {
        max4 = max7;
    } 
    int r_sign;
    int int_tmp_result_FFWKCAA;
    lower_bound_1 = max2;
    upper_bound_1 = max2;
    if( (max1 < lower_bound_1) )
    {
        lower_bound_1 = max1;
    } 
    if( (max4 < lower_bound_1) )
    {
        lower_bound_1 = max4;
    } 
    else 
    {
        if( (max4 > upper_bound_1) )
        {
            upper_bound_1 = max4;
        } 
    } 
    if( (max5 < lower_bound_1) )
    {
        lower_bound_1 = max5;
    } 
    if( (max6 < lower_bound_1) )
    {
        lower_bound_1 = max6;
    } 
    if( (max7 < lower_bound_1) )
    {
        lower_bound_1 = max7;
    } 
    if( (lower_bound_1 < 6.01986729486167248087e-50) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 2.59614842926741294957e+33) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (4.67544471613800658534e-13 * (((((max7 * max2) * max1) * max6) * max5) * max4));
        if( (r > eps) )
        {
            int_tmp_result_FFWKCAA = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result_FFWKCAA = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    r_sign = int_tmp_result_FFWKCAA;
    return (Delta_sign * r_sign);
}